

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::ParameterizedTestFactory<simd_test_avx2::V256_V128V128_avx2_TestIntrinsics_Test>
::CreateTest(ParameterizedTestFactory<simd_test_avx2::V256_V128V128_avx2_TestIntrinsics_Test> *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<unsigned_int,_unsigned_int,_const_char_*>_>::SetParam
            ((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x28);
  simd_test_avx2::V256_V128V128_avx2_TestIntrinsics_Test::V256_V128V128_avx2_TestIntrinsics_Test
            ((V256_V128V128_avx2_TestIntrinsics_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }